

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogicalOperandsTests.cpp
# Opt level: O2

void __thiscall NotOperandTests::Run(NotOperandTests *this)

{
  allocator local_59;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  string local_38 [32];
  
  std::__cxx11::string::string(local_38,"NotOperand is an Operand",&local_59);
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/detail/LogicalOperandsTests.cpp:199:36)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/detail/LogicalOperandsTests.cpp:199:36)>
             ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])(this,local_38)
  ;
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::__cxx11::string::~string(local_38);
  GivenOperandWhenResultOfOperandIsXThenResultIsZ(this,true,false);
  GivenOperandWhenResultOfOperandIsXThenResultIsZ(this,false,true);
  return;
}

Assistant:

virtual void Run()
	{
		Then("NotOperand is an Operand", [&]()
		{
			AssertThat(ut11::detail::IsOperand < ut11::detail::NotOperand < MockOperand<int> >> ::value, ut11::Is::True);
		});

		GivenOperandWhenResultOfOperandIsXThenResultIsZ(true, false);
		GivenOperandWhenResultOfOperandIsXThenResultIsZ(false, true);
	}